

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.c
# Opt level: O0

apx_error_t apx_vm_deserializer_create(apx_vm_deserializer_t *self)

{
  apx_vm_readState_t *paVar1;
  apx_vm_deserializer_t *self_local;
  
  if (self == (apx_vm_deserializer_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else {
    adt_stack_create(&self->stack,state_vdelete);
    paVar1 = state_new();
    self->state = paVar1;
    if (self->state == (apx_vm_readState_t *)0x0) {
      self_local._4_4_ = 2;
    }
    else {
      read_buffer_init(&self->buffer);
      queued_read_state_init(&self->queued_read_state);
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_vm_deserializer_create(apx_vm_deserializer_t* self)
{
   if (self != NULL)
   {
      adt_stack_create(&self->stack, state_vdelete);
      self->state = state_new();
      if (self->state == NULL)
      {
         return APX_MEM_ERROR;
      }
      read_buffer_init(&self->buffer);
      queued_read_state_init(&self->queued_read_state);
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}